

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Queries::FunctionalTest::iterate(FunctionalTest *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *this_01;
  TestLog *this_02;
  MessageBuilder *this_03;
  undefined4 *puVar5;
  uint local_1c0;
  GLuint i;
  MessageBuilder local_1b0;
  byte local_2f;
  bool local_2e;
  undefined1 local_2d;
  deUint32 local_2c;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  FunctionalTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar3);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar4->_vptr_RenderContext[2])();
  local_2c = (deUint32)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)local_2c);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    this->m_pGetQueryBufferObjectiv = *(PFNGLGETQUERYBUFFEROBJECT *)(lStack_20 + 0x9e8);
    this->m_pGetQueryBufferObjectuiv = *(PFNGLGETQUERYBUFFEROBJECT *)(lStack_20 + 0x9f8);
    this->m_pGetQueryBufferObjecti64v = *(PFNGLGETQUERYBUFFEROBJECT *)(lStack_20 + 0x9e0);
    this->m_pGetQueryBufferObjectui64v = *(PFNGLGETQUERYBUFFEROBJECT *)(lStack_20 + 0x9f0);
    local_2e = true;
    local_2f = 0;
    if ((this->m_pGetQueryBufferObjectiv == (PFNGLGETQUERYBUFFEROBJECT)0x0) ||
       (((this->m_pGetQueryBufferObjectuiv == (PFNGLGETQUERYBUFFEROBJECT)0x0 ||
         (this->m_pGetQueryBufferObjecti64v == (PFNGLGETQUERYBUFFEROBJECT)0x0)) ||
        (this->m_pGetQueryBufferObjectui64v == (PFNGLGETQUERYBUFFEROBJECT)0x0)))) {
      this_01 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      this_02 = tcu::TestContext::getLog(this_01);
      tcu::TestLog::operator<<(&local_1b0,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
      this_03 = tcu::MessageBuilder::operator<<
                          (&local_1b0,
                           (char (*) [71])
                           "Test could not get the pointers for glGetQueryBufferObject* functions.")
      ;
      tcu::MessageBuilder::operator<<(this_03,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 0;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
    prepareView(this);
    prepareVertexArray(this);
    prepareBuffers(this);
    prepareQueries(this);
    prepareProgram(this);
    draw(this);
    bVar2 = checkView(this);
    local_2e = (bool)(bVar2 & local_2e);
    bVar2 = checkXFB(this);
    bVar1 = local_2e & 1U & bVar2;
    for (local_1c0 = 0; local_2e = bVar1 != 0, local_1c0 < 4; local_1c0 = local_1c0 + 1) {
      bVar2 = checkQueryBufferObject<int>
                        (this,this->m_qo[local_1c0],0x82ea,
                         *(int *)(s_targets + (ulong)local_1c0 * 4),equal<int>);
      local_2e = (bool)(bVar2 & local_2e);
      bVar2 = checkQueryBufferObject<unsigned_int>
                        (this,this->m_qo[local_1c0],0x82ea,
                         *(uint *)(s_targets + (ulong)local_1c0 * 4),equal<unsigned_int>);
      local_2e = (bool)(bVar2 & local_2e);
      bVar2 = checkQueryBufferObject<long>
                        (this,this->m_qo[local_1c0],0x82ea,
                         (ulong)*(uint *)(s_targets + (ulong)local_1c0 * 4),equal<long>);
      local_2e = (bool)(bVar2 & local_2e);
      bVar2 = checkQueryBufferObject<unsigned_long>
                        (this,this->m_qo[local_1c0],0x82ea,
                         (ulong)*(uint *)(s_targets + (ulong)local_1c0 * 4),equal<unsigned_long>);
      local_2e = (bool)(bVar2 & local_2e);
      bVar2 = checkQueryBufferObject<int>(this,this->m_qo[local_1c0],0x8867,1,equal<int>);
      local_2e = (bool)(bVar2 & local_2e);
      bVar2 = checkQueryBufferObject<unsigned_int>
                        (this,this->m_qo[local_1c0],0x8867,1,equal<unsigned_int>);
      local_2e = (bool)(bVar2 & local_2e);
      bVar2 = checkQueryBufferObject<long>(this,this->m_qo[local_1c0],0x8867,1,equal<long>);
      local_2e = (bool)(bVar2 & local_2e);
      bVar2 = checkQueryBufferObject<unsigned_long>
                        (this,this->m_qo[local_1c0],0x8867,1,equal<unsigned_long>);
      local_2e = (local_2e & 1U & bVar2) != 0;
      if (*(int *)(s_targets + (ulong)local_1c0 * 4) == 0x88bf) {
        bVar2 = checkQueryBufferObject<int>
                          (this,this->m_qo[local_1c0],0x8866,
                           *(int *)(s_results + (ulong)local_1c0 * 4),less<int>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<unsigned_int>
                          (this,this->m_qo[local_1c0],0x8866,
                           *(uint *)(s_results + (ulong)local_1c0 * 4),less<unsigned_int>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<long>
                          (this,this->m_qo[local_1c0],0x8866,
                           (long)*(int *)(s_results + (ulong)local_1c0 * 4),less<long>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<unsigned_long>
                          (this,this->m_qo[local_1c0],0x8866,
                           (long)*(int *)(s_results + (ulong)local_1c0 * 4),less<unsigned_long>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<int>
                          (this,this->m_qo[local_1c0],0x9194,
                           *(int *)(s_results + (ulong)local_1c0 * 4),less<int>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<unsigned_int>
                          (this,this->m_qo[local_1c0],0x9194,
                           *(uint *)(s_results + (ulong)local_1c0 * 4),less<unsigned_int>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<long>
                          (this,this->m_qo[local_1c0],0x9194,
                           (long)*(int *)(s_results + (ulong)local_1c0 * 4),less<long>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<unsigned_long>
                          (this,this->m_qo[local_1c0],0x9194,
                           (long)*(int *)(s_results + (ulong)local_1c0 * 4),less<unsigned_long>);
        bVar1 = local_2e & 1U & bVar2;
      }
      else {
        bVar2 = checkQueryBufferObject<int>
                          (this,this->m_qo[local_1c0],0x8866,
                           *(int *)(s_results + (ulong)local_1c0 * 4),equal<int>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<unsigned_int>
                          (this,this->m_qo[local_1c0],0x8866,
                           *(uint *)(s_results + (ulong)local_1c0 * 4),equal<unsigned_int>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<long>
                          (this,this->m_qo[local_1c0],0x8866,
                           (long)*(int *)(s_results + (ulong)local_1c0 * 4),equal<long>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<unsigned_long>
                          (this,this->m_qo[local_1c0],0x8866,
                           (long)*(int *)(s_results + (ulong)local_1c0 * 4),equal<unsigned_long>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<int>
                          (this,this->m_qo[local_1c0],0x9194,
                           *(int *)(s_results + (ulong)local_1c0 * 4),equal<int>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<unsigned_int>
                          (this,this->m_qo[local_1c0],0x9194,
                           *(uint *)(s_results + (ulong)local_1c0 * 4),equal<unsigned_int>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<long>
                          (this,this->m_qo[local_1c0],0x9194,
                           (long)*(int *)(s_results + (ulong)local_1c0 * 4),equal<long>);
        local_2e = (bool)(bVar2 & local_2e);
        bVar2 = checkQueryBufferObject<unsigned_long>
                          (this,this->m_qo[local_1c0],0x9194,
                           (long)*(int *)(s_results + (ulong)local_1c0 * 4),equal<unsigned_long>);
        bVar1 = local_2e & 1U & bVar2;
      }
    }
    clean(this);
    if ((local_2e & 1U) == 0) {
      if ((local_2f & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Fetching access point to GL functions. */
	m_pGetQueryBufferObjectiv	= (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectiv;
	m_pGetQueryBufferObjectuiv   = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectuiv;
	m_pGetQueryBufferObjecti64v  = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjecti64v;
	m_pGetQueryBufferObjectui64v = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectui64v;

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		if ((DE_NULL == m_pGetQueryBufferObjectiv) || (DE_NULL == m_pGetQueryBufferObjectuiv) ||
			(DE_NULL == m_pGetQueryBufferObjecti64v) || (DE_NULL == m_pGetQueryBufferObjectui64v))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Test could not get the pointers for glGetQueryBufferObject* functions."
				<< tcu::TestLog::EndMessage;

			throw 0;
		}

		prepareView();
		prepareVertexArray();
		prepareBuffers();
		prepareQueries();
		prepareProgram();

		draw();

		/* Make sure that framebuffer and transform feedback buffer are filled with expectd data. */
		is_ok &= checkView();
		is_ok &= checkXFB();

		/* Make comparisons for each query object. */
		for (glw::GLuint i = 0; i < s_targets_count; ++i)
		{
			/* Checking targets. */
			is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_TARGET, s_targets[i],
														&FunctionalTest::equal<glw::GLint>);
			is_ok &= checkQueryBufferObject<glw::GLuint>(m_qo[i], GL_QUERY_TARGET, s_targets[i],
														 &FunctionalTest::equal<glw::GLuint>);
			is_ok &= checkQueryBufferObject<glw::GLint64>(m_qo[i], GL_QUERY_TARGET, s_targets[i],
														  &FunctionalTest::equal<glw::GLint64>);
			is_ok &= checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_TARGET, s_targets[i],
														   &FunctionalTest::equal<glw::GLuint64>);

			/* Checking result availability. */
			is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_RESULT_AVAILABLE, GL_TRUE,
														&FunctionalTest::equal<glw::GLint>);
			is_ok &= checkQueryBufferObject<glw::GLuint>(m_qo[i], GL_QUERY_RESULT_AVAILABLE, GL_TRUE,
														 &FunctionalTest::equal<glw::GLuint>);
			is_ok &= checkQueryBufferObject<glw::GLint64>(m_qo[i], GL_QUERY_RESULT_AVAILABLE, GL_TRUE,
														  &FunctionalTest::equal<glw::GLint64>);
			is_ok &= checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_RESULT_AVAILABLE, GL_TRUE,
														   &FunctionalTest::equal<glw::GLuint64>);

			if (GL_TIME_ELAPSED == s_targets[i])
			{
				/* Checking result. */
				is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_RESULT, (glw::GLint)s_results[i],
															&FunctionalTest::less<glw::GLint>);
				is_ok &= checkQueryBufferObject<glw::GLuint>(m_qo[i], GL_QUERY_RESULT, (glw::GLuint)s_results[i],
															 &FunctionalTest::less<glw::GLuint>);
				is_ok &= checkQueryBufferObject<glw::GLint64>(m_qo[i], GL_QUERY_RESULT, (glw::GLint64)s_results[i],
															  &FunctionalTest::less<glw::GLint64>);
				is_ok &= checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_RESULT, (glw::GLuint64)s_results[i],
															   &FunctionalTest::less<glw::GLuint64>);

				/* Checking result (no-wait). */
				is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLint)s_results[i],
															&FunctionalTest::less<glw::GLint>);
				is_ok &= checkQueryBufferObject<glw::GLuint>(
					m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLuint)s_results[i], &FunctionalTest::less<glw::GLuint>);
				is_ok &= checkQueryBufferObject<glw::GLint64>(
					m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLint64)s_results[i], &FunctionalTest::less<glw::GLint64>);
				is_ok &=
					checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLuint64)s_results[i],
														  &FunctionalTest::less<glw::GLuint64>);
			}
			else
			{
				/* Checking result. */
				is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_RESULT, (glw::GLint)s_results[i],
															&FunctionalTest::equal<glw::GLint>);
				is_ok &= checkQueryBufferObject<glw::GLuint>(m_qo[i], GL_QUERY_RESULT, (glw::GLuint)s_results[i],
															 &FunctionalTest::equal<glw::GLuint>);
				is_ok &= checkQueryBufferObject<glw::GLint64>(m_qo[i], GL_QUERY_RESULT, (glw::GLint64)s_results[i],
															  &FunctionalTest::equal<glw::GLint64>);
				is_ok &= checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_RESULT, (glw::GLuint64)s_results[i],
															   &FunctionalTest::equal<glw::GLuint64>);

				/* Checking result (no-wait). */
				is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLint)s_results[i],
															&FunctionalTest::equal<glw::GLint>);
				is_ok &= checkQueryBufferObject<glw::GLuint>(
					m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLuint)s_results[i], &FunctionalTest::equal<glw::GLuint>);
				is_ok &= checkQueryBufferObject<glw::GLint64>(
					m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLint64)s_results[i], &FunctionalTest::equal<glw::GLint64>);
				is_ok &=
					checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLuint64)s_results[i],
														  &FunctionalTest::equal<glw::GLuint64>);
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}